

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TexImage2DArrayDepthBufferCase::createTexture
          (TexImage2DArrayDepthBufferCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  int param;
  int param_00;
  int iVar1;
  TransferFormat TVar2;
  uint rowPitch;
  deUint32 buf;
  deUint32 tex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vec4 local_78;
  Vec4 local_68;
  PixelBufferAccess local_58;
  
  this_01 = &(this->super_Texture2DArraySpecCase).m_texFormat;
  TVar2 = glu::getTransferFormat((this->super_Texture2DArraySpecCase).m_texFormat);
  iVar1 = tcu::TextureFormat::getPixelSize(this_01);
  param = (this->super_Texture2DArraySpecCase).m_width;
  param_00 = (this->super_Texture2DArraySpecCase).m_height;
  rowPitch = iVar1 * param + 3U & 0xfffffffc;
  iVar1 = rowPitch * param_00;
  tex = 0;
  buf = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)((this->super_Texture2DArraySpecCase).m_numLayers * iVar1));
  local_68.m_data[0] = -1.5;
  local_68.m_data[1] = -2.0;
  local_68.m_data[2] = 1.7;
  local_68.m_data[3] = -1.5;
  local_78.m_data[0] = 2.0;
  local_78.m_data[1] = 1.5;
  local_78.m_data[2] = -1.0;
  local_78.m_data[3] = 2.0;
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,this_01,(this->super_Texture2DArraySpecCase).m_width,
             (this->super_Texture2DArraySpecCase).m_height,
             (this->super_Texture2DArraySpecCase).m_numLayers,rowPitch,iVar1,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::fillWithComponentGradients(&local_58,&local_68,&local_78);
  this_00 = &(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenBuffers(this_00,1,&buf);
  sglr::ContextWrapper::glBindBuffer(this_00,0x88ec,buf);
  sglr::ContextWrapper::glBufferData
            (this_00,0x88ec,
             (long)((int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start),
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806e,param_00);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,param);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806d,0);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,0);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,0);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,4);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8c1a,tex);
  sglr::ContextWrapper::glTexImage3D
            (this_00,0x8c1a,0,this->m_internalFormat,(this->super_Texture2DArraySpecCase).m_width,
             (this->super_Texture2DArraySpecCase).m_height,
             (this->super_Texture2DArraySpecCase).m_numLayers,0,TVar2.format,TVar2.dataType,
             (void *)0x0);
  sglr::ContextWrapper::glDeleteBuffers(this_00,1,&buf);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		int						rowLength		= m_width;
		int						alignment		= 4;
		int						rowPitch		= deAlign32(rowLength*pixelSize, alignment);
		int						imageHeight		= m_height;
		int						slicePitch		= imageHeight*rowPitch;
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		// Fill data with grid.
		data.resize(slicePitch*m_numLayers);
		{
			const Vec4 gMin = Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4 gMax = Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, m_numLayers, rowPitch, slicePitch, &data[0]), gMin, gMax);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER, buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER, (int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_IMAGE_HEIGHT,	imageHeight);
		glPixelStorei(GL_UNPACK_ROW_LENGTH,		rowLength);
		glPixelStorei(GL_UNPACK_SKIP_IMAGES,	0);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		0);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	0);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		alignment);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, m_internalFormat, m_width, m_height, m_numLayers, 0, transferFmt.format, transferFmt.dataType, DE_NULL);
		glDeleteBuffers(1, &buf);
	}